

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parse::Object::setDimencionRequest(Object *this,string *anchor,string *size)

{
  bool bVar1;
  Size *this_00;
  char *pcVar2;
  string *size_local;
  string *anchor_local;
  Object *this_local;
  
  if (this->dimencions == (Size *)0x0) {
    this_00 = (Size *)operator_new(0x40);
    memset(this_00,0,0x40);
    Size::Size(this_00);
    this->dimencions = this_00;
  }
  bVar1 = std::operator==(anchor,"width_request");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)this->dimencions,pcVar2);
  }
  bVar1 = std::operator==(anchor,"width_request");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->dimencions->height,pcVar2);
  }
  return;
}

Assistant:

void setDimencionRequest(std::string anchor, std::string size) {
                if (dimencions == NULL) {
                    dimencions = new Size();
                }
                if (anchor == "width_request") {
                    dimencions->width = (size.c_str());
                }
                if (anchor == "width_request") {
                    dimencions->height = (size.c_str());
                }
            }